

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O1

bool __thiscall ObjectList::hit(ObjectList *this,Ray *r,double t_min,double t_max,Hit *rec)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  bool bVar4;
  shared_ptr<Object> *object;
  pointer psVar5;
  Hit temp_hit;
  double local_a0;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  bool local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  double local_40;
  
  local_50 = (element_type *)0x0;
  _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_68 = 0.0;
  dStack_60 = 0.0;
  psVar5 = (this->objects_).
           super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->objects_).
           super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 == psVar1) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    local_a0 = t_max;
    do {
      peVar2 = (psVar5->super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar3 = (**peVar2->_vptr_Object)(SUB84(t_min,0),local_a0,peVar2,r,&local_88);
      if (((char)iVar3 != '\0') && (local_40 < local_a0)) {
        rec->front_face_ = local_58;
        local_a0 = local_40;
        (rec->n_).e[1] = local_68;
        (rec->n_).e[2] = dStack_60;
        (rec->p_).e[2] = local_78;
        (rec->n_).e[0] = dStack_70;
        (rec->p_).e[0] = local_88;
        (rec->p_).e[1] = dStack_80;
        (rec->material_).super___shared_ptr<Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_50;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(rec->material_).super___shared_ptr<Material,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,&_Stack_48);
        rec->t_ = local_40;
        bVar4 = true;
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
  }
  if (_Stack_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_48._M_pi);
  }
  return bVar4;
}

Assistant:

bool ObjectList::hit(const Ray& r, double t_min, double t_max, Hit& rec) const {
  Hit temp_hit;
  bool hit_something = false;
  double t_curr = t_max;

  for (const auto& object : objects_) {
    if (object->hit(r, t_min, t_curr, temp_hit) && temp_hit.t_ < t_curr) {
      hit_something = true;
      t_curr = temp_hit.t_;
      rec = temp_hit;
    }
  }
  return hit_something;
}